

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O2

void __thiscall
Hospital::Read_From_File_And_Create_Objects<Patient>
          (Hospital *this,vector<Patient,_std::allocator<Patient>_> *All_Of_Humans,fstream *inFile)

{
  string password;
  string password_00;
  string password_01;
  string age;
  string age_00;
  string age_01;
  string gender;
  string gender_00;
  string gender_01;
  string dammy2;
  string dammy2_00;
  string dammy2_01;
  string dammy;
  string dammy_00;
  string dammy_01;
  long lVar1;
  ostream *poVar2;
  int iVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff9d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  temp;
  undefined8 uStack_600;
  undefined8 uStack_5f8;
  istream *local_5f0;
  vector<Patient,_std::allocator<Patient>_> *local_5e8;
  string item;
  string local_5c0 [8];
  string in_stack_fffffffffffffa48;
  string local_580;
  string local_560;
  string local_540;
  string local_520;
  string local_500;
  string local_4e0;
  string local_4c0;
  string s;
  string local_480 [32];
  string local_460 [32];
  string local_440 [32];
  string local_420 [32];
  string local_400 [32];
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380 [32];
  string local_360 [32];
  string local_340 [32];
  string local_320 [32];
  string local_300 [32];
  string local_2e0;
  string local_2c0 [32];
  string local_2a0 [32];
  string local_280 [32];
  string local_260 [32];
  string local_240 [32];
  string local_220 [32];
  string local_200;
  string local_1e0;
  string local_1c0 [32];
  string local_1a0 [32];
  Patient New_Nurse;
  
  local_5e8 = All_Of_Humans;
  if (((byte)inFile[*(long *)(*(long *)inFile + -0x18) + 0x20] & 5) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Error opening file !!! ");
    std::endl<char,std::char_traits<char>>(poVar2);
    exit(1);
  }
  item._M_dataplus._M_p = (pointer)&item.field_2;
  item._M_string_length = 0;
  item.field_2._M_local_buf[0] = '\0';
  temp.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  temp.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  temp.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&s,"7Patient",(allocator *)&New_Nurse);
  iVar3 = 0;
  local_5f0 = (istream *)inFile;
  do {
    if (((byte)local_5f0[*(long *)(*(long *)local_5f0 + -0x18) + 0x20] & 2) != 0) {
      std::__cxx11::string::~string((string *)&s);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&temp);
      std::__cxx11::string::~string((string *)&item);
      return;
    }
    std::operator>>(local_5f0,(string *)&item);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&temp,&item);
    lVar1 = std::__cxx11::string::find((char *)&s,0x11d84d);
    if (iVar3 == 9 && lVar1 != -1) {
      std::__cxx11::string::string
                ((string *)&local_1e0,
                 (string *)
                 temp.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      std::__cxx11::string::string
                ((string *)&local_4c0,
                 (string *)
                 (temp.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 1));
      std::__cxx11::string::string
                ((string *)&local_200,
                 (string *)
                 (temp.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 2));
      std::__cxx11::string::string
                ((string *)&local_4e0,
                 (string *)
                 (temp.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 3));
      std::__cxx11::string::string
                ((string *)&local_500,
                 (string *)
                 (temp.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 4));
      std::__cxx11::string::string
                (local_220,
                 (string *)
                 (temp.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 5));
      std::__cxx11::string::string
                (local_240,
                 (string *)
                 (temp.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 6));
      std::__cxx11::string::string
                (local_260,
                 (string *)
                 (temp.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 7));
      std::__cxx11::string::string
                (local_280,
                 (string *)
                 (temp.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 8));
      std::__cxx11::string::string
                (local_2a0,
                 (string *)
                 (temp.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 9));
      std::__cxx11::string::string(local_2c0,"salam",(allocator *)&stack0xfffffffffffff9e7);
      password._M_string_length = (size_type)local_240;
      password._M_dataplus._M_p = (pointer)local_220;
      password.field_2._M_allocated_capacity = (size_type)local_260;
      password.field_2._8_8_ = local_280;
      age._M_string_length = (size_type)local_2c0;
      age._M_dataplus._M_p = (pointer)local_2a0;
      age.field_2 = in_stack_fffffffffffff9d8;
      gender._M_string_length =
           (size_type)
           temp.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      gender._M_dataplus._M_p =
           (pointer)temp.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      gender.field_2._M_allocated_capacity =
           (size_type)
           temp.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      gender.field_2._8_8_ = uStack_600;
      dammy2._M_string_length = (size_type)local_5f0;
      dammy2._M_dataplus._M_p = (pointer)uStack_5f8;
      dammy2.field_2._M_allocated_capacity = (size_type)local_5e8;
      dammy2.field_2._8_8_ = item._M_dataplus._M_p;
      dammy._M_string_length._0_1_ = item.field_2._M_local_buf[0];
      dammy._M_dataplus._M_p = (pointer)item._M_string_length;
      dammy._9_23_ = stack0xfffffffffffffa31;
      Patient::Patient(&New_Nurse,&local_1e0,&local_4c0,&local_200,&local_4e0,&local_500,password,
                       age,gender,dammy2,dammy,in_stack_fffffffffffffa48);
      std::__cxx11::string::~string(local_2c0);
      std::__cxx11::string::~string(local_2a0);
      std::__cxx11::string::~string(local_280);
      std::__cxx11::string::~string(local_260);
      std::__cxx11::string::~string(local_240);
      std::__cxx11::string::~string(local_220);
      std::__cxx11::string::~string((string *)&local_500);
      std::__cxx11::string::~string((string *)&local_4e0);
      std::__cxx11::string::~string((string *)&local_200);
      std::__cxx11::string::~string((string *)&local_4c0);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::vector<Patient,_std::allocator<Patient>_>::push_back(local_5e8,&New_Nurse);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&temp);
      Patient::~Patient(&New_Nurse);
      iVar3 = -1;
    }
    else {
      lVar1 = std::__cxx11::string::find((char *)&s,0x11d859);
      if (iVar3 == 10 && lVar1 != -1) {
        std::__cxx11::string::string
                  ((string *)&local_2e0,
                   (string *)
                   temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
        std::__cxx11::string::string
                  (local_5c0,
                   (string *)
                   (temp.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1));
        std::__cxx11::string::string
                  ((string *)&local_520,
                   (string *)
                   (temp.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 2));
        std::__cxx11::string::string
                  ((string *)&local_540,
                   (string *)
                   (temp.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 3));
        std::__cxx11::string::string
                  ((string *)&local_560,
                   (string *)
                   (temp.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 4));
        std::__cxx11::string::string
                  (local_300,
                   (string *)
                   (temp.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 5));
        std::__cxx11::string::string
                  (local_320,
                   (string *)
                   (temp.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 6));
        std::__cxx11::string::string
                  (local_340,
                   (string *)
                   (temp.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 7));
        std::__cxx11::string::string
                  (local_360,
                   (string *)
                   (temp.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 8));
        std::__cxx11::string::string
                  (local_380,
                   (string *)
                   (temp.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 9));
        std::__cxx11::string::string
                  (local_1a0,
                   (string *)
                   (temp.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 10));
        password_00._M_string_length = (size_type)local_320;
        password_00._M_dataplus._M_p = (pointer)local_300;
        password_00.field_2._M_allocated_capacity = (size_type)local_340;
        password_00.field_2._8_8_ = local_360;
        age_00._M_string_length = (size_type)local_1a0;
        age_00._M_dataplus._M_p = (pointer)local_380;
        age_00.field_2 = in_stack_fffffffffffff9d8;
        gender_00._M_string_length =
             (size_type)
             temp.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        gender_00._M_dataplus._M_p =
             (pointer)temp.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        gender_00.field_2._M_allocated_capacity =
             (size_type)
             temp.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        gender_00.field_2._8_8_ = uStack_600;
        dammy2_00._M_string_length = (size_type)local_5f0;
        dammy2_00._M_dataplus._M_p = (pointer)uStack_5f8;
        dammy2_00.field_2._M_allocated_capacity = (size_type)local_5e8;
        dammy2_00.field_2._8_8_ = item._M_dataplus._M_p;
        dammy_00._M_string_length._0_1_ = item.field_2._M_local_buf[0];
        dammy_00._M_dataplus._M_p = (pointer)item._M_string_length;
        dammy_00._9_23_ = stack0xfffffffffffffa31;
        Patient::Patient(&New_Nurse,&local_2e0,(string *)local_5c0,&local_520,&local_540,&local_560,
                         password_00,age_00,gender_00,dammy2_00,dammy_00,in_stack_fffffffffffffa48);
        std::__cxx11::string::~string(local_1a0);
        std::__cxx11::string::~string(local_380);
        std::__cxx11::string::~string(local_360);
        std::__cxx11::string::~string(local_340);
        std::__cxx11::string::~string(local_320);
        std::__cxx11::string::~string(local_300);
        std::__cxx11::string::~string((string *)&local_560);
        std::__cxx11::string::~string((string *)&local_540);
        std::__cxx11::string::~string((string *)&local_520);
        std::__cxx11::string::~string(local_5c0);
        std::__cxx11::string::~string((string *)&local_2e0);
        std::vector<Patient,_std::allocator<Patient>_>::push_back(local_5e8,&New_Nurse);
      }
      else {
        lVar1 = std::__cxx11::string::find((char *)&s,0x11d860);
        if (iVar3 != 7 || lVar1 == -1) goto LAB_001183fd;
        std::__cxx11::string::string
                  ((string *)&local_3a0,
                   (string *)
                   temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
        std::__cxx11::string::string
                  ((string *)&local_3c0,
                   (string *)
                   (temp.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1));
        std::__cxx11::string::string
                  ((string *)&local_3e0,
                   (string *)
                   (temp.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 2));
        std::__cxx11::string::string
                  ((string *)&local_580,
                   (string *)
                   (temp.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 3));
        std::__cxx11::string::string
                  ((string *)&stack0xfffffffffffffa60,
                   (string *)
                   (temp.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 4));
        std::__cxx11::string::string
                  (local_400,
                   (string *)
                   (temp.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 5));
        std::__cxx11::string::string
                  (local_420,
                   (string *)
                   (temp.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 6));
        std::__cxx11::string::string
                  (local_440,
                   (string *)
                   (temp.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 7));
        std::__cxx11::string::string(local_460,"salam1",(allocator *)&stack0xfffffffffffff9e7);
        std::__cxx11::string::string(local_480,"salam1",(allocator *)((long)&uStack_5f8 + 7));
        std::__cxx11::string::string(local_1c0,"salam2",(allocator *)((long)&uStack_5f8 + 6));
        password_01._M_string_length = (size_type)local_420;
        password_01._M_dataplus._M_p = (pointer)local_400;
        password_01.field_2._M_allocated_capacity = (size_type)local_440;
        password_01.field_2._8_8_ = local_460;
        age_01._M_string_length = (size_type)local_1c0;
        age_01._M_dataplus._M_p = (pointer)local_480;
        age_01.field_2 = in_stack_fffffffffffff9d8;
        gender_01._M_string_length =
             (size_type)
             temp.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        gender_01._M_dataplus._M_p =
             (pointer)temp.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        gender_01.field_2._M_allocated_capacity =
             (size_type)
             temp.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        gender_01.field_2._8_8_ = uStack_600;
        dammy2_01._M_string_length = (size_type)local_5f0;
        dammy2_01._M_dataplus._M_p = (pointer)uStack_5f8;
        dammy2_01.field_2._M_allocated_capacity = (size_type)local_5e8;
        dammy2_01.field_2._8_8_ = item._M_dataplus._M_p;
        dammy_01._M_string_length._0_1_ = item.field_2._M_local_buf[0];
        dammy_01._M_dataplus._M_p = (pointer)item._M_string_length;
        dammy_01._9_23_ = stack0xfffffffffffffa31;
        Patient::Patient(&New_Nurse,&local_3a0,&local_3c0,&local_3e0,&local_580,
                         (string *)&stack0xfffffffffffffa60,password_01,age_01,gender_01,dammy2_01,
                         dammy_01,in_stack_fffffffffffffa48);
        std::__cxx11::string::~string(local_1c0);
        std::__cxx11::string::~string(local_480);
        std::__cxx11::string::~string(local_460);
        std::__cxx11::string::~string(local_440);
        std::__cxx11::string::~string(local_420);
        std::__cxx11::string::~string(local_400);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffa60);
        std::__cxx11::string::~string((string *)&local_580);
        std::__cxx11::string::~string((string *)&local_3e0);
        std::__cxx11::string::~string((string *)&local_3c0);
        std::__cxx11::string::~string((string *)&local_3a0);
        std::vector<Patient,_std::allocator<Patient>_>::push_back(local_5e8,&New_Nurse);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&temp);
      Patient::~Patient(&New_Nurse);
      iVar3 = -1;
    }
LAB_001183fd:
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

void Hospital::Read_From_File_And_Create_Objects (vector<T>& All_Of_Humans , fstream& inFile){

    if (inFile.fail()){
        cerr << "Error opening file !!! " <<endl;
        exit(1) ;
    }

    int counter = 0 ;
    string item;
    vector<string>temp;
    string s=typeid(T).name();
    while(!inFile.eof()){

        inFile >> item ;
        temp.push_back(item);
        if(s.find("Nurse")!=string::npos && counter == 9){

            T New_Nurse(temp[0], temp[1], temp[2], temp[3], temp[4], temp[5], temp[6], temp[7], temp[8],
                        temp[9] ,"salam");
            All_Of_Humans.push_back(New_Nurse);
            temp.clear();
            counter = -1;

        }
        else if(s.find("Doctor")!=string::npos  && counter == 10) {

            T New_Doctor(temp[0], temp[1], temp[2], temp[3], temp[4], temp[5], temp[6], temp[7], temp[8],
                         temp[9], temp[10] );

            All_Of_Humans.push_back(New_Doctor);
            temp.clear();
            counter =-1;

        }
        else if (s.find("Patient")!=string::npos  && counter == 7) {

            T New_Patient(temp[0], temp[1], temp[2], temp[3], temp[4], temp[5], temp[6], temp[7],"salam1","salam1","salam2"
            );
            All_Of_Humans.push_back(New_Patient);
            temp.clear();
            counter = -1;
        }

        counter++;

    }
}